

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O2

double __thiscall
GammaHandler::photoIonization
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  pointer pvVar5;
  double dVar6;
  
  pvVar1 = (sourceInfo->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = false;
  lVar2 = 0;
  pvVar5 = pvVar1;
  for (lVar3 = 0;
      ((long)(sourceInfo->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18 != lVar3;
      lVar3 = lVar3 + 1) {
    dVar6 = ABS(*(xyTry->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start -
                *(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start);
    if (dVar6 < brThresh) {
      lVar2 = lVar3;
    }
    bVar4 = (bool)(bVar4 | dVar6 < brThresh);
    pvVar5 = pvVar5 + 1;
  }
  dVar6 = 0.0;
  if (bVar4) {
    lVar2 = *(long *)&pvVar1[lVar2].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar6 = (*(double *)(lVar2 + 0x10) /
            (*(double *)(lVar2 + 0x18) + *(double *)(lVar2 + 0x10) + *(double *)(lVar2 + 0x20))) *
            *(double *)(lVar2 + 8) * yMax;
  }
  return dVar6;
}

Assistant:

double GammaHandler::photoIonization(const vector<vector<double>>& sourceInfo,
                                     const vector<double>& xyTry) {
  // implement simple delta function to the spectrum
  std::size_t index{0};
  bool found = false;
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    if (abs(xyTry[0] - initialEnergy) < brThresh) {
      index = i;
      found = true;
    }
  }
  double br = sourceInfo[index][1];
  double pe = sourceInfo[index][2];
  double co = sourceInfo[index][3];
  double pp = sourceInfo[index][4];
  if (found) return yMax * br * (pe / (pe + co + pp));
  return 0.0;
}